

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

uint32_t __thiscall
spirv_cross::CompilerMSL::get_metal_resource_index
          (CompilerMSL *this,SPIRVariable *var,BaseType basetype,uint32_t plane)

{
  ID *__k;
  bool bVar1;
  uint32_t uVar2;
  SPIREntryPoint *pSVar3;
  mapped_type *pmVar4;
  SPIRType *pSVar5;
  iterator iVar6;
  ExtendedDecorations EVar7;
  int iVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  ExtendedDecorations decoration;
  key_type local_3c;
  
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  __k = &(var->super_IVariant).self;
  pmVar4 = ::std::__detail::
           _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
  pSVar5 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                      super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  if (var->storage == StorageClassPushConstant) {
    local_3c.binding = 0;
    uVar10 = 0xffffffff;
  }
  else {
    uVar10 = (pmVar4->decoration).set;
    local_3c.binding = (pmVar4->decoration).binding;
  }
  local_3c.model = pSVar3->model;
  local_3c.desc_set = uVar10;
  iVar6 = ::std::
          _Hashtable<spirv_cross::StageSetBinding,_std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::StageSetBinding>,_spirv_cross::InternalHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->resource_bindings)._M_h,&local_3c);
  EVar7 = SPIRVCrossDecorationResourceIndexTertiary;
  if (plane != 1) {
    EVar7 = (basetype == AtomicCounter ||
            basetype == Sampler && *(int *)&(pSVar5->super_IVariant).field_0xc == 0x11) |
            SPIRVCrossDecorationResourceIndexPrimary;
  }
  decoration = SPIRVCrossDecorationResourceIndexQuaternary;
  if (plane != 2) {
    decoration = EVar7;
  }
  if (iVar6.
      super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    bVar1 = Compiler::has_extended_decoration((Compiler *)this,__k->id,decoration);
    if (bVar1) {
      uVar9 = Compiler::get_extended_decoration((Compiler *)this,__k->id,decoration);
    }
    else {
      pSVar5 = Variant::get<spirv_cross::SPIRType>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)&(var->super_IVariant).field_0xc);
      if (((*(int *)&(pSVar5->super_IVariant).field_0xc == 0x10) &&
          ((pSVar5->image).dim == DimSubpassData)) &&
         ((this->msl_options).use_framebuffer_fetch_subpasses == true)) {
        uVar9 = Compiler::get_decoration
                          ((Compiler *)this,(ID)__k->id,DecorationInputAttachmentIndex);
      }
      else if ((((this->msl_options).enable_decoration_binding != true) ||
               (bVar1 = Compiler::has_decoration((Compiler *)this,(ID)__k->id,DecorationBinding),
               !bVar1)) ||
              (uVar9 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationBinding),
              (int)uVar9 < 0)) {
        if (var->storage == StorageClassPushConstant) {
          bVar1 = false;
        }
        else {
          bVar1 = false;
          if ((uVar10 < 8) && ((this->msl_options).argument_buffers != false)) {
            bVar1 = (this->argument_buffer_discrete_mask >> (uVar10 & 0x1f) & 1) == 0;
          }
        }
        if ((int)(pSVar5->array).super_VectorView<unsigned_int>.buffer_size == 0) {
          iVar8 = 1;
        }
        else {
          iVar8 = 1;
          uVar9 = 0;
          do {
            uVar2 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar5,uVar9);
            iVar8 = iVar8 * uVar2;
            uVar9 = uVar9 + 1;
          } while (uVar9 < (uint)(pSVar5->array).super_VectorView<unsigned_int>.buffer_size);
        }
        if (iVar8 == 0) {
          __assert_fail("binding_stride != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_msl.cpp"
                        ,0x361a,
                        "uint32_t spirv_cross::CompilerMSL::get_metal_resource_index(SPIRVariable &, SPIRType::BaseType, uint32_t)"
                       );
        }
        if (bVar1) {
          uVar9 = this->next_metal_resource_ids[uVar10];
          this->next_metal_resource_ids[uVar10] = iVar8 + uVar9;
        }
        else if (basetype == Sampler) {
          uVar9 = this->next_metal_resource_index_sampler;
          this->next_metal_resource_index_sampler = iVar8 + uVar9;
        }
        else if (basetype == Image) {
          uVar9 = this->next_metal_resource_index_texture;
          this->next_metal_resource_index_texture = iVar8 + uVar9;
        }
        else {
          uVar9 = this->next_metal_resource_index_buffer;
          this->next_metal_resource_index_buffer = iVar8 + uVar9;
        }
        Compiler::set_extended_decoration((Compiler *)this,__k->id,decoration,uVar9);
      }
    }
  }
  else {
    *(undefined1 *)
     ((long)iVar6.
            super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
            ._M_cur + 0x34) = 1;
    uVar10 = __k->id;
    if (basetype == Sampler) {
      Compiler::set_extended_decoration
                ((Compiler *)this,uVar10,decoration,
                 *(uint32_t *)
                  ((long)iVar6.
                         super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                         ._M_cur + 0x30));
      uVar9 = *(uint32_t *)
               ((long)iVar6.
                      super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                      ._M_cur + 0x30);
    }
    else if (basetype == Image) {
      Compiler::set_extended_decoration
                ((Compiler *)this,uVar10,decoration,
                 *(int *)((long)iVar6.
                                super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                                ._M_cur + 0x2c) + plane);
      uVar9 = plane + *(int *)((long)iVar6.
                                     super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                                     ._M_cur + 0x2c);
    }
    else {
      Compiler::set_extended_decoration
                ((Compiler *)this,uVar10,decoration,
                 *(uint32_t *)
                  ((long)iVar6.
                         super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                         ._M_cur + 0x28));
      uVar9 = *(uint32_t *)
               ((long)iVar6.
                      super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                      ._M_cur + 0x28);
    }
  }
  return uVar9;
}

Assistant:

uint32_t CompilerMSL::get_metal_resource_index(SPIRVariable &var, SPIRType::BaseType basetype, uint32_t plane)
{
	auto &execution = get_entry_point();
	auto &var_dec = ir.meta[var.self].decoration;
	auto &var_type = get<SPIRType>(var.basetype);
	uint32_t var_desc_set = (var.storage == StorageClassPushConstant) ? kPushConstDescSet : var_dec.set;
	uint32_t var_binding = (var.storage == StorageClassPushConstant) ? kPushConstBinding : var_dec.binding;

	// If a matching binding has been specified, find and use it.
	auto itr = resource_bindings.find({ execution.model, var_desc_set, var_binding });

	// Atomic helper buffers for image atomics need to use secondary bindings as well.
	bool use_secondary_binding = (var_type.basetype == SPIRType::SampledImage && basetype == SPIRType::Sampler) ||
	                             basetype == SPIRType::AtomicCounter;

	auto resource_decoration =
	    use_secondary_binding ? SPIRVCrossDecorationResourceIndexSecondary : SPIRVCrossDecorationResourceIndexPrimary;

	if (plane == 1)
		resource_decoration = SPIRVCrossDecorationResourceIndexTertiary;
	if (plane == 2)
		resource_decoration = SPIRVCrossDecorationResourceIndexQuaternary;

	if (itr != end(resource_bindings))
	{
		auto &remap = itr->second;
		remap.second = true;
		switch (basetype)
		{
		case SPIRType::Image:
			set_extended_decoration(var.self, resource_decoration, remap.first.msl_texture + plane);
			return remap.first.msl_texture + plane;
		case SPIRType::Sampler:
			set_extended_decoration(var.self, resource_decoration, remap.first.msl_sampler);
			return remap.first.msl_sampler;
		default:
			set_extended_decoration(var.self, resource_decoration, remap.first.msl_buffer);
			return remap.first.msl_buffer;
		}
	}

	// If we have already allocated an index, keep using it.
	if (has_extended_decoration(var.self, resource_decoration))
		return get_extended_decoration(var.self, resource_decoration);

	auto &type = get<SPIRType>(var.basetype);

	if (type_is_msl_framebuffer_fetch(type))
	{
		// Frame-buffer fetch gets its fallback resource index from the input attachment index,
		// which is then treated as color index.
		return get_decoration(var.self, DecorationInputAttachmentIndex);
	}
	else if (msl_options.enable_decoration_binding)
	{
		// Allow user to enable decoration binding.
		// If there is no explicit mapping of bindings to MSL, use the declared binding as a fallback.
		if (has_decoration(var.self, DecorationBinding))
		{
			var_binding = get_decoration(var.self, DecorationBinding);
			// Avoid emitting sentinel bindings.
			if (var_binding < 0x80000000u)
				return var_binding;
		}
	}

	// If we did not explicitly remap, allocate bindings on demand.
	// We cannot reliably use Binding decorations since SPIR-V and MSL's binding models are very different.

	bool allocate_argument_buffer_ids = false;

	if (var.storage != StorageClassPushConstant)
		allocate_argument_buffer_ids = descriptor_set_is_argument_buffer(var_desc_set);

	uint32_t binding_stride = 1;
	for (uint32_t i = 0; i < uint32_t(type.array.size()); i++)
		binding_stride *= to_array_size_literal(type, i);

	assert(binding_stride != 0);

	// If a binding has not been specified, revert to incrementing resource indices.
	uint32_t resource_index;

	if (allocate_argument_buffer_ids)
	{
		// Allocate from a flat ID binding space.
		resource_index = next_metal_resource_ids[var_desc_set];
		next_metal_resource_ids[var_desc_set] += binding_stride;
	}
	else
	{
		// Allocate from plain bindings which are allocated per resource type.
		switch (basetype)
		{
		case SPIRType::Image:
			resource_index = next_metal_resource_index_texture;
			next_metal_resource_index_texture += binding_stride;
			break;
		case SPIRType::Sampler:
			resource_index = next_metal_resource_index_sampler;
			next_metal_resource_index_sampler += binding_stride;
			break;
		default:
			resource_index = next_metal_resource_index_buffer;
			next_metal_resource_index_buffer += binding_stride;
			break;
		}
	}

	set_extended_decoration(var.self, resource_decoration, resource_index);
	return resource_index;
}